

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::FOREACH_OP(SQVM *this,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *o3,SQObjectPtr *o4,
                SQInteger arg_2,int exitpos,int *jump)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  bool bVar3;
  uint uVar4;
  SQInteger SVar5;
  SQObjectPtr *obj;
  SQChar *pSVar6;
  SQInteger local_80;
  SQInteger idx;
  undefined1 local_68 [8];
  SQObjectPtr closure;
  SQObjectPtr itr;
  SQInteger nrefidx;
  SQInteger arg_2_local;
  SQObjectPtr *o4_local;
  SQObjectPtr *o3_local;
  SQObjectPtr *o2_local;
  SQObjectPtr *o1_local;
  SQVM *this_local;
  
  SVar1 = (o1->super_SQObject)._type;
  if (SVar1 == OT_STRING) {
    SVar5 = SQString::Next((o1->super_SQObject)._unVal.pString,o4,o2,o3);
    if (SVar5 != -1) {
      ::SQObjectPtr::operator=(o4,SVar5);
      *jump = 1;
      return true;
    }
    *jump = exitpos;
    return true;
  }
  if (SVar1 == OT_ARRAY) {
    SVar5 = SQArray::Next((o1->super_SQObject)._unVal.pArray,o4,o2,o3);
    if (SVar5 != -1) {
      ::SQObjectPtr::operator=(o4,SVar5);
      *jump = 1;
      return true;
    }
    *jump = exitpos;
    return true;
  }
  if (SVar1 == OT_GENERATOR) {
    if (((o1->super_SQObject)._unVal.pGenerator)->_state == eDead) {
      *jump = exitpos;
      return true;
    }
    if (((o1->super_SQObject)._unVal.pGenerator)->_state == eSuspended) {
      local_80 = 0;
      if ((o4->super_SQObject)._type == OT_INTEGER) {
        local_80 = (o4->super_SQObject)._unVal.nInteger + 1;
      }
      ::SQObjectPtr::operator=(o2,local_80);
      ::SQObjectPtr::operator=(o4,local_80);
      SQGenerator::Resume((o1->super_SQObject)._unVal.pGenerator,this,o3);
      *jump = 0;
      return true;
    }
  }
  else {
    if (SVar1 == OT_CLASS) {
      SVar5 = SQClass::Next((o1->super_SQObject)._unVal.pClass,o4,o2,o3);
      if (SVar5 != -1) {
        ::SQObjectPtr::operator=(o4,SVar5);
        *jump = 1;
        return true;
      }
      *jump = exitpos;
      return true;
    }
    if (SVar1 == OT_TABLE) {
      SVar5 = SQTable::Next((o1->super_SQObject)._unVal.pTable,false,o4,o2,o3);
      if (SVar5 != -1) {
        ::SQObjectPtr::operator=(o4,SVar5);
        *jump = 1;
        return true;
      }
      *jump = exitpos;
      return true;
    }
    if ((SVar1 == OT_USERDATA) || (SVar1 == OT_INSTANCE)) {
      if ((((o1->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate == (SQTable *)0x0) {
        return false;
      }
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&closure.super_SQObject._unVal);
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_68);
      pSVar2 = (o1->super_SQObject)._unVal.pTable;
      uVar4 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[6])(pSVar2,this,9,local_68);
      if ((uVar4 & 1) == 0) {
        Raise_Error(this,"_nexti failed");
        this_local._7_1_ = false;
      }
      else {
        Push(this,o1);
        Push(this,o4);
        bVar3 = CallMetaMethod(this,(SQObjectPtr *)local_68,MT_NEXTI,2,
                               (SQObjectPtr *)&closure.super_SQObject._unVal);
        if (bVar3) {
          obj = ::SQObjectPtr::operator=(o2,(SQObjectPtr *)&closure.super_SQObject._unVal);
          ::SQObjectPtr::operator=(o4,obj);
          if (closure.super_SQObject._unVal.fFloat == 2.350989e-38) {
            *jump = exitpos;
            this_local._7_1_ = true;
          }
          else {
            bVar3 = Get(this,o1,(SQObjectPtr *)&closure.super_SQObject._unVal,o3,0,0x29a);
            if (bVar3) {
              *jump = 1;
              this_local._7_1_ = true;
            }
            else {
              Raise_Error(this,"_nexti returned an invalid idx");
              this_local._7_1_ = false;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_68);
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&closure.super_SQObject._unVal);
      return this_local._7_1_;
    }
  }
  pSVar6 = GetTypeName(o1);
  Raise_Error(this,"cannot iterate %s",pSVar6);
  return false;
}

Assistant:

bool SQVM::FOREACH_OP(SQObjectPtr &o1,SQObjectPtr &o2,SQObjectPtr
&o3,SQObjectPtr &o4,SQInteger SQ_UNUSED_ARG(arg_2),int exitpos,int &jump)
{
    SQInteger nrefidx;
    switch(sq_type(o1)) {
    case OT_TABLE:
        if((nrefidx = _table(o1)->Next(false,o4, o2, o3)) == -1) _FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_ARRAY:
        if((nrefidx = _array(o1)->Next(o4, o2, o3)) == -1) _FINISH(exitpos);
        o4 = (SQInteger) nrefidx; _FINISH(1);
    case OT_STRING:
        if((nrefidx = _string(o1)->Next(o4, o2, o3)) == -1)_FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_CLASS:
        if((nrefidx = _class(o1)->Next(o4, o2, o3)) == -1)_FINISH(exitpos);
        o4 = (SQInteger)nrefidx; _FINISH(1);
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o1)->_delegate) {
            SQObjectPtr itr;
            SQObjectPtr closure;
            if(_delegable(o1)->GetMetaMethod(this, MT_NEXTI, closure)) {
                Push(o1);
                Push(o4);
                if(CallMetaMethod(closure, MT_NEXTI, 2, itr)) {
                    o4 = o2 = itr;
                    if(sq_type(itr) == OT_NULL) _FINISH(exitpos);
                    if(!Get(o1, itr, o3, 0, DONT_FALL_BACK)) {
                        Raise_Error(_SC("_nexti returned an invalid idx")); // cloud be changed
                        return false;
                    }
                    _FINISH(1);
                }
                else {
                    return false;
                }
            }
            Raise_Error(_SC("_nexti failed"));
            return false;
        }
        break;
    case OT_GENERATOR:
        if(_generator(o1)->_state == SQGenerator::eDead) _FINISH(exitpos);
        if(_generator(o1)->_state == SQGenerator::eSuspended) {
            SQInteger idx = 0;
            if(sq_type(o4) == OT_INTEGER) {
                idx = _integer(o4) + 1;
            }
            o2 = idx;
            o4 = idx;
            _generator(o1)->Resume(this, o3);
            _FINISH(0);
        }
    default:
        Raise_Error(_SC("cannot iterate %s"), GetTypeName(o1));
    }
    return false; //cannot be hit(just to avoid warnings)
}